

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhereState.hpp
# Opt level: O0

void __thiscall
linq::
WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
::Init(WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>
       *this)

{
  bool bVar1;
  int x;
  byte local_19;
  WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>
  *this_local;
  
  IEnumerable<int>::Init(&this->source);
  while( true ) {
    bVar1 = IEnumerable<int>::Valid(&this->source);
    local_19 = 0;
    if (bVar1) {
      x = IEnumerable<int>::Current(&this->source);
      bVar1 = anon_class_1_0_00000001_for_filter::operator()
                        ((anon_class_1_0_00000001_for_filter *)&this->field_0x20,x);
      local_19 = bVar1 ^ 0xff;
    }
    if ((local_19 & 1) == 0) break;
    IEnumerable<int>::Advance(&this->source);
  }
  return;
}

Assistant:

void Init() final override 
			{ 
				source.Init(); 
				
				while(source.Valid() && !filter(source.Current()))
					source.Advance();
			}